

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

bool __thiscall
Memory::Recycler::ExplicitFreeInternal<(Memory::ObjectInfoBits)0,MediumAllocationBlockAttributes>
          (Recycler *this,void *buffer,size_t size,size_t sizeCat)

{
  CollectionState CVar1;
  undefined4 *puVar2;
  code *pcVar3;
  undefined8 sizeCat_00;
  bool bVar4;
  ObjectInfoBits OVar5;
  DWORD DVar6;
  DWORD DVar7;
  int iVar8;
  LargeHeapBlock *this_00;
  undefined4 extraout_var;
  byte bVar9;
  LargeHeapBlock *largeHeapBlock;
  undefined8 *in_FS_OFFSET;
  undefined1 auStack_68 [8];
  RecyclerHeapObjectInfo info;
  
  CVar1 = (this->collectionState).value;
  if (CVar1 == CollectionStateExit || (char)((CVar1 & CollectionStateSweep) >> 1) != '\0') {
    bVar9 = 0;
  }
  else {
    if (((CVar1 >> 0xd & 1) == 0) &&
       ((CVar1 & (CollectionStatePostSweepRedeferralCallback|CollectionStatePostCollectionCallback))
        == CollectionStateNotCollecting && CVar1 != CollectionStateNotCollecting)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x4ab,
                         "(this->IsConcurrentState() || !this->CollectionInProgress() || this->IsAllocatableCallbackState())"
                         ,
                         "this->IsConcurrentState() || !this->CollectionInProgress() || this->IsAllocatableCallbackState()"
                        );
      if (!bVar4) goto LAB_0029bae2;
      *puVar2 = 0;
    }
    info.m_recycler = (Recycler *)0x0;
    info.m_heapBlock = (HeapBlock *)0x0;
    auStack_68 = (undefined1  [8])0x0;
    info.m_address = (void *)0x0;
    info.field_3._0_1_ = 0;
    bVar4 = FindHeapObject(this,buffer,FindHeapObjectFlags_NoFreeBitVerify,
                           (RecyclerHeapObjectInfo *)auStack_68);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x4b1,
                         "(this->FindHeapObject(buffer, FindHeapObjectFlags_NoFreeBitVerify, info))"
                         ,"this->FindHeapObject(buffer, FindHeapObjectFlags_NoFreeBitVerify, info)")
      ;
      if (!bVar4) goto LAB_0029bae2;
      *puVar2 = 0;
    }
    OVar5 = RecyclerHeapObjectInfo::GetAttributes((RecyclerHeapObjectInfo *)auStack_68);
    if ((OVar5 & ~LeafBit) != NoBit) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x4b2,"((info.GetAttributes() & ~ObjectInfoBits::LeafBit) == 0)",
                         "(info.GetAttributes() & ~ObjectInfoBits::LeafBit) == 0");
      if (!bVar4) goto LAB_0029bae2;
      *puVar2 = 0;
    }
    if (this->mainThreadHandle != (HANDLE)0x0) {
      DVar6 = GetCurrentThreadId();
      DVar7 = GetThreadId(this->mainThreadHandle);
      if (DVar6 != DVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar2 = (undefined4 *)*in_FS_OFFSET;
        *puVar2 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                           ,0x4ba,
                           "(this->mainThreadHandle == 0 || ::GetCurrentThreadId() == ::GetThreadId(this->mainThreadHandle))"
                           ,
                           "this->mainThreadHandle == NULL || ::GetCurrentThreadId() == ::GetThreadId(this->mainThreadHandle)"
                          );
        if (!bVar4) goto LAB_0029bae2;
        *puVar2 = 0;
      }
    }
    info._32_8_ = sizeCat;
    this_00 = (LargeHeapBlock *)FindHeapBlock(this,buffer);
    if (this_00 == (LargeHeapBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x4be,"(heapBlock != nullptr)","heapBlock != nullptr");
      if (!bVar4) goto LAB_0029bae2;
      *puVar2 = 0;
    }
    iVar8 = (*(this_00->super_HeapBlock)._vptr_HeapBlock[5])(this_00);
    if (&this->autoHeap != (HeapInfoManager *)CONCAT44(extraout_var,iVar8)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x4c1,"(heapInfo == heapBlock->GetHeapInfo())",
                         "heapInfo == heapBlock->GetHeapInfo()");
      if (!bVar4) {
LAB_0029bae2:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar2 = 0;
    }
    sizeCat_00 = info._32_8_;
    bVar4 = this->isPageHeapEnabled;
    if (bVar4 == true) {
      if ((((this->capturePageHeapFreeStack == true) &&
           ((this_00->super_HeapBlock).heapBlockType == LargeBlockType)) &&
          (this_00->pageHeapData != (PageHeapData *)0x0)) &&
         (this_00->pageHeapData->pageHeapMode != PageHeapModeOff)) {
        LargeHeapBlock::CapturePageHeapFreeStack(this_00);
      }
    }
    else {
      SetExplicitFreeBitOnSmallBlock<MediumAllocationBlockAttributes>
                (this,(HeapBlock *)this_00,info._32_8_,buffer,NoBit);
      HeapInfo::FreeMediumObject<(Memory::ObjectInfoBits)0>
                (&(this->autoHeap).defaultHeap,buffer,sizeCat_00);
      iVar8 = -0x36;
      if (this->verifyEnabled == false) {
        iVar8 = 0;
      }
      memset((void *)((long)buffer + 8),iVar8,size - 8);
      if (this->trackerDictionary != (TypeInfotoTrackerItemMap *)0x0) {
        SetTrackerData(this,buffer,&TrackerData::ExplicitFreeListObjectData);
      }
    }
    bVar9 = bVar4 ^ 1;
  }
  return (bool)bVar9;
}

Assistant:

bool Recycler::ExplicitFreeInternal(void* buffer, size_t size, size_t sizeCat)
{
    // If the GC is in sweep state while FreeInternal is called, we might be executing a finalizer
    // which called Free, which would cause a "sweepable" buffer to be free-listed. Don't allow this.
    // Also don't allow freeing while we're shutting down the recycler since finalizers get executed
    // at this stage too
    if (this->IsSweeping() || this->IsExiting())
    {
        return false;
    }

#if ENABLE_CONCURRENT_GC
    // We shouldn't be freeing object when we are running GC in thread
    Assert(this->IsConcurrentState() || !this->CollectionInProgress() || this->IsAllocatableCallbackState());
#else
    Assert(!this->CollectionInProgress() || this->IsAllocatableCallbackState());
#endif

    DebugOnly(RecyclerHeapObjectInfo info);
    Assert(this->FindHeapObject(buffer, FindHeapObjectFlags_NoFreeBitVerify, info));
    Assert((info.GetAttributes() & ~ObjectInfoBits::LeafBit) == 0);          // Only NoBit or LeafBit

    HeapInfo * heapInfo = this->GetHeapInfo<attributes>();
#if DBG || defined(RECYCLER_MEMORY_VERIFY) || defined(RECYCLER_PAGE_HEAP)

    // Either the mainThreadHandle is null (we're not thread bound)
    // or we should be calling this function on the main script thread
    Assert(this->mainThreadHandle == NULL ||
        ::GetCurrentThreadId() == ::GetThreadId(this->mainThreadHandle));

    HeapBlock* heapBlock = this->FindHeapBlock(buffer);

    Assert(heapBlock != nullptr);

#if DBG
    Assert(heapInfo == heapBlock->GetHeapInfo());
#endif

#ifdef RECYCLER_PAGE_HEAP
    if (this->IsPageHeapEnabled())
    {
#ifdef STACK_BACK_TRACE
        if (this->ShouldCapturePageHeapFreeStack())
        {
            if (heapBlock->IsLargeHeapBlock())
            {
                LargeHeapBlock* largeHeapBlock = (LargeHeapBlock*)heapBlock;
                if (largeHeapBlock->InPageHeapMode())
                {
                    largeHeapBlock->CapturePageHeapFreeStack();
                }
            }
        }
#endif

        // Don't do actual explicit free in page heap mode
        return false;
    }
#endif

    SetExplicitFreeBitOnSmallBlock<TBlockAttributes>(heapBlock, sizeCat, buffer, attributes);

#endif

    if (TBlockAttributes::IsMediumBlock)
    {
        heapInfo->FreeMediumObject<attributes>(buffer, sizeCat);
    }
    else
    {
        heapInfo->FreeSmallObject<attributes>(buffer, sizeCat);
    }

    if (size > sizeof(FreeObject) || TBlockAttributes::IsMediumBlock)
    {
        // Do this on the background somehow?
        byte expectedFill = 0;
        size_t fillSize = size - sizeof(FreeObject);

#ifdef RECYCLER_MEMORY_VERIFY
        if (this->VerifyEnabled())
        {
            expectedFill = Recycler::VerifyMemFill;
        }
#endif

        memset(((char*)buffer) + sizeof(FreeObject), expectedFill, fillSize);
    }

#ifdef PROFILE_RECYCLER_ALLOC
    if (this->trackerDictionary != nullptr)
    {
        this->SetTrackerData(buffer, &TrackerData::ExplicitFreeListObjectData);
    }
#endif

    return true;
}